

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpperf.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  undefined8 uVar6;
  char **in_RSI;
  char *pcVar7;
  int in_EDI;
  fd_set *__arr;
  uint __i;
  int opt;
  uint last_sn;
  uint sn;
  uint n_pci;
  timeval timeo;
  timeval diff_tv;
  timeval end_tv;
  timeval start_tv;
  unsigned_long percent;
  unsigned_long rcvlen;
  uint fflen_digits;
  unsigned_long fflen;
  uchar ll_dl;
  uchar brs;
  uchar stmin;
  uchar bs;
  int datidx;
  int rx_extaddr;
  int rx_ext;
  int extaddr;
  int ext;
  canid_t dst;
  canid_t src;
  int ret;
  int i;
  int nbytes;
  int canfd_on;
  canfd_frame frame;
  can_filter rfilter [2];
  sockaddr_can addr;
  int running;
  int s;
  fd_set rdfs;
  uint local_1bc;
  uint local_1ac;
  timeval local_1a0;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  ulong local_160;
  ulong local_158;
  uint local_14c;
  ulong local_148;
  byte local_140;
  byte local_13f;
  byte local_13e;
  byte local_13d;
  int local_13c;
  uint local_138;
  int local_134;
  uint local_130;
  int local_12c;
  uint local_128;
  uint local_124;
  int local_120;
  int local_11c;
  int local_118;
  uint local_114;
  uint local_110;
  byte local_10c;
  byte local_10b;
  byte local_108 [64];
  uint local_c8 [3];
  undefined4 local_bc;
  sockaddr local_b0;
  int local_98;
  int local_94;
  fd_set local_90;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_98 = 1;
  local_114 = 1;
  local_124 = 0xffffffff;
  local_128 = 0xffffffff;
  local_12c = 0;
  local_130 = 0;
  local_134 = 0;
  local_138 = 0;
  local_13c = 0;
  local_13d = 0;
  local_13e = 0;
  local_13f = 0;
  local_140 = 0;
  local_148 = 0;
  local_14c = 0;
  local_158 = 0;
  local_160 = 0;
  local_1ac = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (uVar2 = getopt(local_8,local_10,"s:d:x:X:?"), uVar2 != 0xffffffff) {
    if (uVar2 == 0x3f) {
      __xpg_basename(*local_10);
      print_usage((char *)0x1015d4);
      exit(0);
    }
    if (uVar2 == 0x58) {
      local_134 = 1;
      uVar5 = strtoul(_optarg,(char **)0x0,0x10);
      local_138 = (uint)uVar5 & 0xff;
    }
    else if (uVar2 == 100) {
      uVar5 = strtoul(_optarg,(char **)0x0,0x10);
      local_128 = (uint)uVar5;
      sVar4 = strlen(_optarg);
      if (7 < sVar4) {
        local_128 = local_128 | 0x80000000;
      }
    }
    else if (uVar2 == 0x73) {
      uVar5 = strtoul(_optarg,(char **)0x0,0x10);
      local_124 = (uint)uVar5;
      sVar4 = strlen(_optarg);
      if (7 < sVar4) {
        local_124 = local_124 | 0x80000000;
      }
    }
    else {
      if (uVar2 != 0x78) {
        fprintf(_stderr,"Unknown option %c\n",(ulong)uVar2);
        __xpg_basename(*local_10);
        print_usage((char *)0x10160f);
        exit(1);
      }
      local_12c = 1;
      uVar5 = strtoul(_optarg,(char **)0x0,0x10);
      local_130 = (uint)uVar5 & 0xff;
    }
  }
  if (((local_8 - _optind != 1) || (local_124 == 0xffffffff)) || (local_128 == 0xffffffff)) {
    __xpg_basename(*local_10);
    print_usage((char *)0x10165f);
    exit(0);
  }
  local_94 = socket(0x1d,3,1);
  if (local_94 < 0) {
    perror("socket");
    local_4 = 1;
  }
  else {
    setsockopt(local_94,0x65,5,&local_114,4);
    if ((local_124 & 0x80000000) == 0) {
      local_c8[0] = local_124 & 0x7ff;
      local_c8[1] = 0xc00007ff;
    }
    else {
      local_c8[0] = local_124 & 0x9fffffff;
      local_c8[1] = 0xdfffffff;
    }
    if ((local_128 & 0x80000000) == 0) {
      local_c8[2] = local_128 & 0x7ff;
      local_bc = 0xc00007ff;
    }
    else {
      local_c8[2] = local_128 & 0x9fffffff;
      local_bc = 0xdfffffff;
    }
    setsockopt(local_94,0x65,1,local_c8,0x10);
    local_b0.sa_family = 0x1d;
    local_b0.sa_data._2_4_ = if_nametoindex(local_10[_optind]);
    if (local_b0.sa_data._2_4_ == 0) {
      perror("if_nametoindex");
      local_4 = 1;
    }
    else {
      iVar3 = bind(local_94,&local_b0,0x18);
      if (iVar3 < 0) {
        perror("bind");
        local_4 = 1;
      }
      else {
LAB_00101820:
        if (local_98 != 0) {
          for (local_1bc = 0; local_1bc < 0x10; local_1bc = local_1bc + 1) {
            local_90.fds_bits[local_1bc] = 0;
          }
          local_90.fds_bits[local_94 / 0x40] =
               1L << ((byte)((long)local_94 % 0x40) & 0x3f) | local_90.fds_bits[local_94 / 0x40];
          local_1a0.tv_sec = 1;
          local_1a0.tv_usec = 0;
          local_120 = select(local_94 + 1,&local_90,(fd_set *)0x0,(fd_set *)0x0,&local_1a0);
          if (local_120 < 0) {
            local_98 = 0;
          }
          else {
            if ((local_158 != 0) &&
               ((local_90.fds_bits[local_94 / 0x40] & 1L << ((byte)((long)local_94 % 0x40) & 0x3f))
                == 0)) {
              printf("\r%-*s",0x4e," (transmission timed out)");
              fflush(_stdout);
              local_158 = 0;
              local_148 = 0;
              goto LAB_00101820;
            }
            uVar5 = read(local_94,&local_110,0x48);
            local_118 = (int)uVar5;
            if (local_118 < 0) {
              perror("read");
              local_120 = local_118;
              local_98 = 0;
            }
            else {
              if ((local_118 != 0x10) && (local_118 != 0x48)) {
                fprintf(_stderr,"read: incomplete CAN frame %zu %d\n",0x48,uVar5 & 0xffffffff);
                local_120 = local_118;
                local_98 = 0;
                goto LAB_00101820;
              }
              if (((local_158 == 0) ||
                  (((local_114 == 0 || (local_118 == 0x48)) &&
                   ((local_114 != 0 || (local_118 == 0x10)))))) &&
                 ((local_12c == 0 || (local_130 == local_108[0])))) {
                if (local_110 == local_128) {
                  if (((local_134 != 0) && (local_108[0] != local_138)) ||
                     ((local_108[local_134] & 0xf0) != 0x30)) goto LAB_00101820;
                  local_13d = local_108[local_134 + 1];
                  local_13e = local_108[local_134 + 2];
                }
                local_13c = 0;
                bVar1 = local_108[local_12c];
                uVar2 = (uint)bVar1;
                if ((bVar1 & 0xf0) == 0) {
                  if ((bVar1 & 0xf) == 0) {
                    local_148 = (ulong)local_108[local_12c + 1];
                    local_13c = local_12c + 2;
                  }
                  else {
                    local_148 = (ulong)(uVar2 & 0xf);
                    local_13c = local_12c + 1;
                  }
                  if ((ulong)local_10c < local_148 + (long)local_13c) {
                    local_148 = 0;
                  }
                  local_158 = local_148;
                  local_14c = getdigits((uint)local_148);
                  local_13f = local_10b & 1;
                  local_140 = local_10c;
                  if (local_10c < 8) {
                    local_140 = 8;
                  }
                  ioctl(local_94,0x8906,&local_170);
                  local_114 = (uint)(local_118 != 0x10);
                }
                else if ((uVar2 & 0xf0) == 0x10) {
                  local_148 = (ulong)((uVar2 & 0xf) * 0x100 + (uint)local_108[local_12c + 1]);
                  if (local_148 == 0) {
                    local_148 = (ulong)(int)((uint)local_108[local_12c + 2] * 0x1000000 +
                                             (uint)local_108[local_12c + 3] * 0x10000 +
                                             (uint)local_108[local_12c + 4] * 0x100 +
                                            (uint)local_108[local_12c + 5]);
                    local_13c = local_12c + 6;
                  }
                  else {
                    local_13c = local_12c + 2;
                  }
                  if (0x418936 < local_148) {
                    printf("fflen %lu is more than ~4.2 MB - ignoring PDU\n",local_148);
                    fflush(_stdout);
                    local_158 = 0;
                    local_148 = 0;
                    goto LAB_00101820;
                  }
                  local_158 = (ulong)(int)((uint)local_10c - local_13c);
                  local_1ac = 0;
                  local_14c = getdigits((uint)local_148);
                  local_13f = local_10b & 1;
                  local_140 = local_10c;
                  ioctl(local_94,0x8906,&local_170);
                  local_114 = (uint)(local_118 != 0x10);
                }
                else if ((((uVar2 & 0xf0) == 0x20) && (local_158 != 0)) &&
                        ((uVar2 & 0xf) == (local_1ac + 1 & 0xf))) {
                  local_13c = local_12c + 1;
                  local_158 = (long)(int)((uint)local_10c - local_13c) + local_158;
                  local_1ac = uVar2 & 0xf;
                }
                if (local_158 != 0) {
                  if (local_148 < local_158) {
                    local_158 = local_148;
                  }
                  local_160 = (local_158 * 100) / local_148;
                  printf("\r %3lu%% ",local_160,(local_158 * 100) % local_148);
                  printf("|");
                  if (100 < local_160) {
                    local_160 = 100;
                  }
                  for (local_11c = 0; local_11c < 0x32; local_11c = local_11c + 1) {
                    if (local_11c < (int)(local_160 >> 1)) {
                      printf("X");
                    }
                    else {
                      printf(".");
                    }
                  }
                  printf("| %*lu/%lu ",(ulong)local_14c,local_158,local_148);
                }
                if ((local_158 != 0) && (local_148 <= local_158)) {
                  pcVar7 = "CAN2.0";
                  if (local_114 != 0) {
                    pcVar7 = "CAN-FD";
                  }
                  uVar6 = 0x20;
                  if (local_13f != 0) {
                    uVar6 = 0x2a;
                  }
                  printf("\r%s %02d%c (BS:%2hhu # ",pcVar7,(ulong)local_140,uVar6,(ulong)local_13d);
                  if (local_13e < 0x80) {
                    printf("STmin:%3hhu msec)",(ulong)local_13e);
                  }
                  else if ((local_13e < 0xf1) || (0xf9 < local_13e)) {
                    printf("STmin: invalid   )");
                  }
                  else {
                    printf("STmin:%3u usec)",(ulong)((local_13e & 0xf) * 100));
                  }
                  printf(" : %lu byte in ",local_148);
                  ioctl(local_94,0x8906,&local_180);
                  local_190 = local_180 - local_170;
                  local_188 = local_178 - local_168;
                  if (local_188 < 0) {
                    local_190 = local_190 + -1;
                    local_188 = local_188 + 1000000;
                  }
                  if (local_190 < 0) {
                    local_188 = 0;
                    local_190 = 0;
                  }
                  if (local_190 * 1000 + local_188 / 1000 == 0) {
                    printf("(no time available)     ");
                  }
                  else {
                    printf("%llu.%06llus ",local_190,local_188);
                    uVar5 = local_190 * 1000 + local_188 / 1000;
                    printf("=> %lu byte/s",(local_148 * 1000) / uVar5,(local_148 * 1000) % uVar5);
                  }
                  printf("\n");
                  local_158 = 0;
                  local_148 = 0;
                }
                fflush(_stdout);
              }
            }
          }
          goto LAB_00101820;
        }
        close(local_94);
        local_4 = local_120;
      }
    }
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
	fd_set rdfs;
	int s;
	int running = 1;
	struct sockaddr_can addr;
	struct can_filter rfilter[2];
	struct canfd_frame frame;
	int canfd_on = 1;
	int nbytes, i, ret;
	canid_t src = NO_CAN_ID;
	canid_t dst = NO_CAN_ID;
	int ext = 0;
	int extaddr = 0;
	int rx_ext = 0;
	int rx_extaddr = 0;
	int datidx = 0;
	unsigned char bs = 0;
	unsigned char stmin = 0;
	unsigned char brs = 0;
	unsigned char ll_dl = 0;
	unsigned long fflen = 0;
	unsigned fflen_digits = 0;
	unsigned long rcvlen = 0;
	unsigned long percent = 0;
	struct timeval start_tv, end_tv, diff_tv, timeo;
	unsigned int n_pci;
	unsigned int sn, last_sn = 0;
	int opt;

	while ((opt = getopt(argc, argv, "s:d:x:X:?")) != -1) {
		switch (opt) {
		case 's':
			src = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				src |= CAN_EFF_FLAG;
			break;

		case 'd':
			dst = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				dst |= CAN_EFF_FLAG;
			break;

		case 'x':
			ext = 1;
			extaddr = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case 'X':
			rx_ext = 1;
			rx_extaddr = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			exit(1);
			break;
		}
	}

	if ((argc - optind) != 1 || src == NO_CAN_ID || dst == NO_CAN_ID) {
		print_usage(basename(argv[0]));
		exit(0);
	}

	if ((s = socket(PF_CAN, SOCK_RAW, CAN_RAW)) < 0) {
		perror("socket");
		return 1;
	}

	/* try to switch the socket into CAN FD mode */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES, &canfd_on, sizeof(canfd_on));

	/* set single CAN ID raw filters for src and dst frames */
	if (src & CAN_EFF_FLAG) {
		rfilter[0].can_id   = src & (CAN_EFF_MASK | CAN_EFF_FLAG);
		rfilter[0].can_mask = (CAN_EFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	} else {
		rfilter[0].can_id   = src & CAN_SFF_MASK;
		rfilter[0].can_mask = (CAN_SFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	}

	if (dst & CAN_EFF_FLAG) {
		rfilter[1].can_id   = dst & (CAN_EFF_MASK | CAN_EFF_FLAG);
		rfilter[1].can_mask = (CAN_EFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	} else {
		rfilter[1].can_id   = dst & CAN_SFF_MASK;
		rfilter[1].can_mask = (CAN_SFF_MASK|CAN_EFF_FLAG|CAN_RTR_FLAG);
	}

	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, &rfilter, sizeof(rfilter));

	addr.can_family = AF_CAN;
	addr.can_ifindex = if_nametoindex(argv[optind]);
	if (!addr.can_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	while (running) {

		FD_ZERO(&rdfs);
		FD_SET(s, &rdfs);

		/* timeout for ISO TP transmissions */
		timeo.tv_sec  = 1;
		timeo.tv_usec = 0;

		if ((ret = select(s+1, &rdfs, NULL, NULL, &timeo)) < 0) {
			running = 0;
			continue;
		}

		/* detected timeout of already started transmission */
		if (rcvlen && !(FD_ISSET(s, &rdfs))) {
			printf("\r%-*s",78, " (transmission timed out)");
			fflush(stdout);
			fflen = rcvlen = 0;
			continue;
		}

		nbytes = read(s, &frame, sizeof(frame));
		if (nbytes < 0) {
			perror("read");
			ret = nbytes;
			running = 0;
			continue;
		}
		if (nbytes != CAN_MTU && nbytes != CANFD_MTU) {
			fprintf(stderr, "read: incomplete CAN frame %zu %d\n", sizeof(frame), nbytes);
			ret = nbytes;
			running = 0;
			continue;
		}

		if (rcvlen) {
			/* make sure to process only the detected PDU CAN frame type */
			if (canfd_on && (nbytes != CANFD_MTU))
				continue;
			if (!canfd_on && (nbytes != CAN_MTU))
				continue;
		}

			/* check extended address if provided */
			if (ext && extaddr != frame.data[0])
				continue;

			/* only get flow control information from dst CAN ID */
			if (frame.can_id == dst) {
				/* check extended address if provided */
				if (rx_ext && frame.data[0] != rx_extaddr)
					continue;

				n_pci = frame.data[rx_ext];
				/* check flow control PCI only */
				if ((n_pci & 0xF0) != 0x30)
					continue;

				bs = frame.data[rx_ext + 1];
				stmin = frame.data[rx_ext + 2];
			}

			/* data content starts and index datidx */
			datidx = 0;

			n_pci = frame.data[ext];
			switch (n_pci & 0xF0) {

			case 0x00:
				/* SF */
				if (n_pci & 0xF) {
					fflen = rcvlen = n_pci & 0xF;
					datidx = ext+1;
				} else {
					fflen = rcvlen = frame.data[ext + 1];
					datidx = ext+2;
				}

				/* ignore incorrect SF PDUs */
				if (frame.len < rcvlen + datidx)
					fflen = rcvlen = 0;

				/* get number of digits for printing */
				fflen_digits = getdigits(fflen);

				/* get CAN FD bitrate & LL_DL setting information */
				brs = frame.flags & CANFD_BRS;
				ll_dl = frame.len;
				if (ll_dl < 8)
					ll_dl = 8;

				ioctl(s, SIOCGSTAMP, &start_tv);

				/* determine CAN frame mode for this PDU */
				if (nbytes == CAN_MTU)
					canfd_on = 0;
				else
					canfd_on = 1;

				break;

			case 0x10:
				/* FF */
				fflen = ((n_pci & 0x0F)<<8) + frame.data[ext+1];
				if (fflen)
					datidx = ext+2;
				else {
					fflen = (frame.data[ext+2]<<24) +
						(frame.data[ext+3]<<16) +
						(frame.data[ext+4]<<8) +
						frame.data[ext+5];
					datidx = ext+6;
				}

				/* to increase the time resolution we multiply fflen with 1000 later */
				if (fflen >= (UINT32_MAX / 1000)) {
					printf("fflen %lu is more than ~4.2 MB - ignoring PDU\n", fflen);
					fflush(stdout);
					fflen = rcvlen = 0;
					continue;
				}
				rcvlen = frame.len - datidx;
				last_sn = 0;

				/* get number of digits for printing */
				fflen_digits = getdigits(fflen);

				/* get CAN FD bitrate & LL_DL setting information */
				brs = frame.flags & CANFD_BRS;
				ll_dl = frame.len;

				ioctl(s, SIOCGSTAMP, &start_tv);

				/* determine CAN frame mode for this PDU */
				if (nbytes == CAN_MTU)
					canfd_on = 0;
				else
					canfd_on = 1;

				break;

			case 0x20:
				/* CF */
				if (rcvlen) {
					sn = n_pci & 0x0F;
					if (sn == ((last_sn + 1) & 0xF)) {
						last_sn = sn;
						datidx = ext+1;
						rcvlen += frame.len - datidx;
					}
				}
				break;

			default:
				break;
			}

			/* PDU reception in process */
			if (rcvlen) {
				if (rcvlen > fflen)
					rcvlen = fflen;

				percent = (rcvlen * 100 / fflen);
				printf("\r %3lu%% ", percent);

				printf("|");

				if (percent > 100)
					percent = 100;

				for (i=0; i < NUMBAR; i++){
					if (i < (int)(percent/PERCENTRES))
						printf("X");
					else
						printf(".");
				}
				printf("| %*lu/%lu ", fflen_digits, rcvlen, fflen);
			}

			/* PDU complete */
			if (rcvlen && rcvlen >= fflen) {

				printf("\r%s %02d%c (BS:%2hhu # ", canfd_on?"CAN-FD":"CAN2.0", ll_dl, brs?'*':' ', bs);
				if (stmin < 0x80)
					printf("STmin:%3hhu msec)", stmin);
				else if (stmin > 0xF0 && stmin < 0xFA)
					printf("STmin:%3u usec)", (stmin & 0xF) * 100);
				else
					printf("STmin: invalid   )");

				printf(" : %lu byte in ", fflen);

				/* calculate time */
				ioctl(s, SIOCGSTAMP, &end_tv);
				diff_tv.tv_sec  = end_tv.tv_sec  - start_tv.tv_sec;
				diff_tv.tv_usec = end_tv.tv_usec - start_tv.tv_usec;
				if (diff_tv.tv_usec < 0)
					diff_tv.tv_sec--, diff_tv.tv_usec += 1000000;
				if (diff_tv.tv_sec < 0)
					diff_tv.tv_sec = diff_tv.tv_usec = 0;

				/* check devisor to be not zero */
				if (diff_tv.tv_sec * 1000 + diff_tv.tv_usec / 1000){
					printf("%llu.%06llus ", (unsigned long long)diff_tv.tv_sec, (unsigned long long)diff_tv.tv_usec);
					printf("=> %lu byte/s", (fflen * 1000) /
					       (unsigned long)(diff_tv.tv_sec * 1000 + diff_tv.tv_usec / 1000));
				} else
					printf("(no time available)     ");

				printf("\n");
				/* wait for next PDU */
				fflen = rcvlen = 0;
			}
			fflush(stdout);
	}

	close(s);

	return ret;
}